

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersennetwister.h
# Opt level: O0

uint32 __thiscall MTRand::randInt(MTRand *this,uint32 *n)

{
  ulong uVar1;
  uint32 uVar2;
  ulong uVar3;
  uint32 i;
  uint32 used;
  uint32 *n_local;
  MTRand *this_local;
  
  uVar1 = *n >> 1 | *n;
  uVar1 = uVar1 >> 2 | uVar1;
  uVar1 = uVar1 >> 4 | uVar1;
  uVar1 = uVar1 >> 8 | uVar1;
  do {
    uVar2 = randInt(this);
    uVar3 = uVar2 & (uVar1 >> 0x10 | uVar1);
  } while (*n < uVar3);
  return uVar3;
}

Assistant:

MTRand::uint32 MTRand::randInt(const uint32 &n) {
  // Find which bits are used in n
  // Optimized by Magnus Jonsson (magnus@smartelectronix.com)
  uint32 used = n;
  used |= used >> 1;
  used |= used >> 2;
  used |= used >> 4;
  used |= used >> 8;
  used |= used >> 16;

  // Draw numbers until one is found in [0,n]
  uint32 i;
  do
    i = randInt() & used; // toss unused bits to shorten search
  while (i > n);
  return i;
}